

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O3

vector<duckdb::LogicalType,_true> *
duckdb::ExchangeAllNullTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          vector<duckdb::LogicalType,_true> *types)

{
  LogicalType *pLVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  vector<duckdb::LogicalType,_true> *extraout_RAX;
  undefined7 extraout_var;
  vector<duckdb::LogicalType,_true> *extraout_RAX_00;
  vector<duckdb::LogicalType,_true> *__range1;
  LogicalType *type;
  LogicalType *type_00;
  LogicalType local_38;
  vector<duckdb::LogicalType,_true> *pvVar5;
  
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             __return_storage_ptr__,
             &types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pLVar1 = (__return_storage_ptr__->
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar5 = extraout_RAX;
  for (type_00 = (__return_storage_ptr__->
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start; type_00 != pLVar1; type_00 = type_00 + 1)
  {
    bVar4 = ExpressionBinder::ContainsNullType(type_00);
    pvVar5 = (vector<duckdb::LogicalType,_true> *)CONCAT71(extraout_var,bVar4);
    if (bVar4) {
      ExpressionBinder::ExchangeNullType(&local_38,type_00);
      type_00->id_ = local_38.id_;
      type_00->physical_type_ = local_38.physical_type_;
      peVar2 = (type_00->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = (type_00->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (type_00->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_38.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (type_00->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_38.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_38.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      local_38.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var3;
      LogicalType::~LogicalType(&local_38);
      pvVar5 = extraout_RAX_00;
    }
  }
  return pvVar5;
}

Assistant:

static vector<LogicalType> ExchangeAllNullTypes(const vector<LogicalType> &types) {
	vector<LogicalType> result = types;
	for (auto &type : result) {
		if (ExpressionBinder::ContainsNullType(type)) {
			type = ExpressionBinder::ExchangeNullType(type);
		}
	}
	return result;
}